

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_gather2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  short sVar1;
  short sVar2;
  long lVar3;
  logical lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  Integer _index2_1 [7];
  int _i_8;
  int _ndim_8;
  int _ndim_7;
  int _i_7;
  int _itmp_3;
  int rc_3;
  Integer index_1 [7];
  Integer _index2 [7];
  int _i_6;
  int _ndim_6;
  int _ndim_5;
  int _i_5;
  int _itmp_2;
  int rc_2;
  Integer index [7];
  int rc_1;
  int rc;
  char err_string_5 [256];
  Integer this_count;
  char err_string_4 [256];
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer _num_rstrctd;
  Integer _jw;
  Integer _iw;
  Integer _p_handle;
  Integer _hi [2];
  Integer _lo [2];
  Integer g_handle;
  Integer proc_place;
  Integer offset;
  Integer _jhi;
  Integer _jlo;
  Integer _ihi;
  Integer _ilo;
  char err_string_3 [256];
  char err_string_2 [256];
  char err_string_1 [256];
  char err_string [256];
  Integer subscrpt [2];
  Integer num_blocks;
  char **ptr_ref;
  Integer hi [2];
  Integer lo [2];
  Integer *owner;
  Integer *ldp;
  Integer *jhi;
  Integer *jlo;
  Integer *ihi;
  Integer *ilo;
  armci_giov_t desc;
  void **ptr_org;
  void ***ptr_dst;
  void ***ptr_src;
  Integer *nelem;
  Integer *count;
  Integer iproc;
  Integer p_handle;
  Integer nproc;
  Integer handle;
  char *buf2;
  char *buf1;
  Integer *map;
  Integer naproc;
  Integer *aproc;
  Integer item_size;
  Integer proc;
  Integer kk;
  Integer k;
  long in_stack_fffffffffffff5f8;
  armci_giov_t *in_stack_fffffffffffff600;
  long alStack_9e8 [7];
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  long local_998 [8];
  long alStack_958 [7];
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  int local_90c;
  long local_908 [7];
  int local_8d0;
  int local_8cc;
  char local_8c8 [96];
  Integer in_stack_fffffffffffff798;
  char *in_stack_fffffffffffff7a0;
  char local_7b8 [128];
  Integer *in_stack_fffffffffffff8c8;
  void *in_stack_fffffffffffff8d0;
  Integer in_stack_fffffffffffff8d8;
  Integer in_stack_fffffffffffff8e0;
  Integer *in_stack_fffffffffffff908;
  Integer *in_stack_fffffffffffff910;
  Integer in_stack_fffffffffffff918;
  Integer in_stack_fffffffffffff920;
  Integer *in_stack_fffffffffffff928;
  Integer *in_stack_fffffffffffff930;
  Integer in_stack_fffffffffffff938;
  int local_6ac;
  int local_6a8;
  int local_6a4;
  int local_69c;
  int local_698 [7];
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  int local_668 [10];
  int local_640;
  int local_63c;
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  C_Integer local_5c8;
  C_Integer local_5c0;
  C_Integer local_5b8;
  long local_5b0;
  armci_giov_t *local_5a8;
  long local_5a0;
  long local_598 [4];
  long local_578;
  long local_570;
  long local_568;
  long local_560;
  armci_giov_t *local_558;
  long local_550;
  char local_548 [256];
  char local_448 [256];
  char local_348 [256];
  char local_248 [256];
  undefined8 local_148;
  undefined8 local_140;
  long local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  void *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  void *local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  Integer local_88;
  long local_80;
  undefined8 *local_78;
  void *local_70;
  void *local_68;
  long local_60;
  void *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_80 = in_RDI + 1000;
  local_138 = 0;
  if (0 < in_R8) {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
      sprintf(local_248,"%s: INVALID ARRAY HANDLE","ga_gather");
      pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    }
    if (GA[local_10 + 1000].actv == 0) {
      sprintf(local_348,"%s: ARRAY NOT ACTIVE","ga_gather");
      pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    }
    GAstat.numgat = GAstat.numgat + 1;
    local_90 = (long)GA[local_80].p_handle;
    if (local_90 < 0) {
      local_88 = GAnproc;
      if (0 < GA[local_80].num_rstrctd) {
        local_88 = GA[local_80].num_rstrctd;
      }
    }
    else {
      local_88 = (Integer)PGRP_LIST[local_90].map_nproc;
    }
    if (GA[local_80].distr_type == 0) {
      local_70 = malloc((long)((int)(local_88 << 2) + (int)local_30) << 3);
      if (local_70 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      }
    }
    else {
      local_138 = GA[local_80].block_total;
      local_70 = malloc((long)((int)(local_138 << 2) + (int)local_30) << 3);
      if (local_70 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      }
    }
    local_108 = local_70;
    local_a0 = (void *)((long)local_70 + local_30 * 8);
    lVar3 = local_138;
    if (GA[local_80].distr_type == 0) {
      lVar3 = local_88;
    }
    local_58 = (void *)((long)local_a0 + lVar3 * 0x10);
    local_68 = (void *)((long)local_a0 + lVar3 * 0x18);
    local_a8 = (void *)((long)local_a0 + lVar3 * 8);
    if (GA[local_80].distr_type == 0) {
      for (local_40 = 0; local_40 < local_88; local_40 = local_40 + 1) {
        *(undefined8 *)((long)local_a0 + local_40 * 8) = 0;
        *(undefined8 *)((long)local_a8 + local_40 * 8) = 0;
      }
    }
    else {
      for (local_40 = 0; local_40 < local_138; local_40 = local_40 + 1) {
        *(undefined8 *)((long)local_a0 + local_40 * 8) = 0;
        *(undefined8 *)((long)local_a8 + local_40 * 8) = 0;
      }
    }
    if (GA[local_80].num_rstrctd == 0) {
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        local_148 = *(undefined8 *)(local_20 + local_38 * 8);
        local_140 = *(undefined8 *)(local_28 + local_38 * 8);
        lVar4 = pnga_locate(in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                            in_stack_fffffffffffff928);
        if (lVar4 == 0) {
          sprintf(local_448,"invalid i/j=(%ld,%ld)",*(undefined8 *)(local_20 + local_38 * 8),
                  *(undefined8 *)(local_28 + local_38 * 8));
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
        local_98 = *(long *)((long)local_108 + local_38 * 8);
        *(long *)((long)local_a8 + local_98 * 8) = *(long *)((long)local_a8 + local_98 * 8) + 1;
      }
    }
    else {
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        local_148 = *(undefined8 *)(local_20 + local_38 * 8);
        local_140 = *(undefined8 *)(local_28 + local_38 * 8);
        lVar4 = pnga_locate(in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                            in_stack_fffffffffffff928);
        if (lVar4 == 0) {
          sprintf(local_548,"invalid i/j=(%ld,%ld)",*(undefined8 *)(local_20 + local_38 * 8),
                  *(undefined8 *)(local_28 + local_38 * 8));
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
        local_98 = GA[local_80].rank_rstrctd[*(long *)((long)local_108 + local_38 * 8)];
        *(long *)((long)local_a8 + local_98 * 8) = *(long *)((long)local_a8 + local_98 * 8) + 1;
      }
    }
    local_60 = 0;
    if (GA[local_80].distr_type == 0) {
      for (local_38 = 0; local_38 < local_88; local_38 = local_38 + 1) {
        if (0 < *(long *)((long)local_a8 + local_38 * 8)) {
          *(long *)((long)local_58 + local_60 * 8) = local_38;
          *(long *)((long)local_68 + local_38 * 8) = local_60;
          local_60 = local_60 + 1;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < local_138; local_38 = local_38 + 1) {
        if (0 < *(long *)((long)local_a8 + local_38 * 8)) {
          *(long *)((long)local_58 + local_60 * 8) = local_38;
          *(long *)((long)local_68 + local_38 * 8) = local_60;
          local_60 = local_60 + 1;
        }
      }
    }
    GAstat.numgat_procs = local_60 + GAstat.numgat_procs;
    local_78 = (undefined8 *)
               malloc((long)((int)(local_60 << 4) + (int)(local_30 << 4) + (int)local_60 * 0x28 +
                            (int)(local_60 << 3)));
    if (local_78 == (undefined8 *)0x0) {
      pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    }
    local_b0 = local_78;
    local_b8 = local_78 + local_60;
    local_c0 = local_78 + local_60 * 2;
    local_130 = local_78 + local_60 * 2 + local_30 * 2;
    local_e0 = local_130 + local_60;
    local_e8 = local_e0 + local_60;
    local_f0 = local_e8 + local_60;
    local_f8 = local_f0 + local_60;
    local_100 = local_f0 + local_60 + local_60;
    if (GA[local_80].distr_type == 0) {
      for (local_40 = 0; local_40 < local_60; local_40 = local_40 + 1) {
        local_98 = *(long *)((long)local_58 + local_40 * 8);
        if (0 < GA[local_80].num_rstrctd) {
          local_98 = GA[local_80].rstrctd_list[local_98];
        }
        pnga_distribution(in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                          in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        local_e0[local_40] = local_118;
        local_f0[local_40] = local_110;
        local_e8[local_40] = local_128;
        local_f8[local_40] = local_120;
        local_598[3] = local_10 + 1000;
        local_5b8 = GA[local_598[3]].width[0];
        local_5c0 = GA[local_598[3]].width[1];
        local_5c8 = GA[local_598[3]].num_rstrctd;
        if (GA[local_598[3]].distr_type == 0) {
          if (GA[local_598[3]].num_rstrctd == 0) {
            local_5f0 = (long)GA[local_598[3]].ndim;
            local_5f8 = 0;
            local_5d8 = 1;
            for (local_5e0 = 0; local_5e0 < local_5f0; local_5e0 = local_5e0 + 1) {
              local_5d8 = GA[local_598[3]].nblock[local_5e0] * local_5d8;
            }
            if ((local_5d8 + -1 < *(long *)((long)local_58 + local_40 * 8)) ||
               (*(long *)((long)local_58 + local_40 * 8) < 0)) {
              for (local_5e0 = 0; local_5e0 < local_5f0; local_5e0 = local_5e0 + 1) {
                local_598[local_5e0] = 0;
                (&local_5a8)[local_5e0] = (armci_giov_t *)0xffffffffffffffff;
              }
            }
            else {
              local_5e8 = *(long *)((long)local_58 + local_40 * 8);
              for (local_5e0 = 0; local_5e0 < local_5f0; local_5e0 = local_5e0 + 1) {
                local_5d0 = local_5e8 % (long)GA[local_598[3]].nblock[local_5e0];
                local_5e8 = local_5e8 / (long)GA[local_598[3]].nblock[local_5e0];
                local_600 = local_5d0 + local_5f8;
                local_5f8 = GA[local_598[3]].nblock[local_5e0] + local_5f8;
                local_598[local_5e0] = GA[local_598[3]].mapc[local_600];
                if (local_5d0 == GA[local_598[3]].nblock[local_5e0] + -1) {
                  (&local_5a8)[local_5e0] = (armci_giov_t *)GA[local_598[3]].dims[local_5e0];
                }
                else {
                  (&local_5a8)[local_5e0] =
                       (armci_giov_t *)(GA[local_598[3]].mapc[local_600 + 1] + -1);
                }
              }
            }
          }
          else if (*(long *)((long)local_58 + local_40 * 8) < GA[local_598[3]].num_rstrctd) {
            local_628 = (long)GA[local_598[3]].ndim;
            local_630 = 0;
            local_610 = 1;
            for (local_618 = 0; local_618 < local_628; local_618 = local_618 + 1) {
              local_610 = GA[local_598[3]].nblock[local_618] * local_610;
            }
            if ((local_610 + -1 < *(long *)((long)local_58 + local_40 * 8)) ||
               (*(long *)((long)local_58 + local_40 * 8) < 0)) {
              for (local_618 = 0; local_618 < local_628; local_618 = local_618 + 1) {
                local_598[local_618] = 0;
                (&local_5a8)[local_618] = (armci_giov_t *)0xffffffffffffffff;
              }
            }
            else {
              local_620 = *(long *)((long)local_58 + local_40 * 8);
              for (local_618 = 0; local_618 < local_628; local_618 = local_618 + 1) {
                local_608 = local_620 % (long)GA[local_598[3]].nblock[local_618];
                local_620 = local_620 / (long)GA[local_598[3]].nblock[local_618];
                local_638 = local_608 + local_630;
                local_630 = GA[local_598[3]].nblock[local_618] + local_630;
                local_598[local_618] = GA[local_598[3]].mapc[local_638];
                if (local_608 == GA[local_598[3]].nblock[local_618] + -1) {
                  (&local_5a8)[local_618] = (armci_giov_t *)GA[local_598[3]].dims[local_618];
                }
                else {
                  (&local_5a8)[local_618] =
                       (armci_giov_t *)(GA[local_598[3]].mapc[local_638 + 1] + -1);
                }
              }
            }
          }
          else {
            sVar1 = GA[local_598[3]].ndim;
            local_640 = (int)sVar1;
            for (local_63c = 0; local_63c < sVar1; local_63c = local_63c + 1) {
              local_598[local_63c] = 0;
              (&local_5a8)[local_63c] = (armci_giov_t *)0xffffffffffffffff;
            }
          }
        }
        else if (((GA[local_598[3]].distr_type == 1) || (GA[local_598[3]].distr_type == 2)) ||
                (GA[local_598[3]].distr_type == 3)) {
          sVar1 = GA[local_598[3]].ndim;
          local_670 = (int)sVar1;
          sVar2 = GA[local_598[3]].ndim;
          local_67c = (int)sVar2;
          local_674 = (int)*(undefined8 *)((long)local_58 + local_40 * 8);
          local_668[0] = (int)((long)local_674 % GA[local_598[3]].num_blocks[0]);
          for (local_678 = 1; local_678 < sVar2; local_678 = local_678 + 1) {
            local_674 = (int)((long)(local_674 - local_668[local_678 + -1]) /
                             GA[local_598[3]].num_blocks[local_678 + -1]);
            local_668[local_678] = (int)((long)local_674 % GA[local_598[3]].num_blocks[local_678]);
          }
          for (local_66c = 0; local_66c < sVar1; local_66c = local_66c + 1) {
            local_598[local_66c] =
                 (long)local_668[local_66c] * GA[local_598[3]].block_dims[local_66c] + 1;
            (&local_5a8)[local_66c] =
                 (armci_giov_t *)
                 ((long)(local_668[local_66c] + 1) * GA[local_598[3]].block_dims[local_66c]);
            if (GA[local_598[3]].dims[local_66c] < (long)(&local_5a8)[local_66c]) {
              (&local_5a8)[local_66c] = (armci_giov_t *)GA[local_598[3]].dims[local_66c];
            }
          }
        }
        else if (GA[local_598[3]].distr_type == 4) {
          sVar1 = GA[local_598[3]].ndim;
          local_6a4 = 0;
          sVar2 = GA[local_598[3]].ndim;
          local_6a8 = (int)*(undefined8 *)((long)local_58 + local_40 * 8);
          local_698[0] = (int)((long)local_6a8 % GA[local_598[3]].num_blocks[0]);
          for (local_6ac = 1; local_6ac < sVar2; local_6ac = local_6ac + 1) {
            local_6a8 = (int)((long)(local_6a8 - local_698[local_6ac + -1]) /
                             GA[local_598[3]].num_blocks[local_6ac + -1]);
            local_698[local_6ac] = (int)((long)local_6a8 % GA[local_598[3]].num_blocks[local_6ac]);
          }
          for (local_69c = 0; local_69c < sVar1; local_69c = local_69c + 1) {
            local_598[local_69c] = GA[local_598[3]].mapc[local_6a4 + local_698[local_69c]];
            if ((long)local_698[local_69c] < GA[local_598[3]].num_blocks[local_69c] + -1) {
              (&local_5a8)[local_69c] =
                   (armci_giov_t *)
                   (GA[local_598[3]].mapc[local_6a4 + local_698[local_69c] + 1] + -1);
            }
            else {
              (&local_5a8)[local_69c] = (armci_giov_t *)GA[local_598[3]].dims[local_69c];
            }
            local_6a4 = local_6a4 + (int)GA[local_598[3]].num_blocks[local_69c];
          }
        }
        local_5b0 = (long)GA[local_598[3]].p_handle;
        if ((long)GA[local_598[3]].p_handle == 0) {
          local_578 = (long)PGRP_LIST->inv_map_proc_list[*(long *)((long)local_58 + local_40 * 8)];
        }
        else {
          local_578 = *(long *)((long)local_58 + local_40 * 8);
          if (local_5c8 != 0) {
            local_578 = GA[local_598[3]].rstrctd_list[local_578];
          }
        }
        local_550 = local_598[0];
        local_558 = local_5a8;
        local_560 = local_598[1];
        local_568 = local_5a0;
        if (((((long)local_e0[local_40] < local_598[0]) ||
             ((long)local_5a8 < (long)local_e0[local_40])) ||
            ((long)local_f0[local_40] < local_598[1])) || (local_5a0 < (long)local_f0[local_40])) {
          in_stack_fffffffffffff5f8 = local_598[0];
          in_stack_fffffffffffff600 = local_5a8;
          sprintf(local_7b8,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
                  *(undefined8 *)((long)local_58 + local_40 * 8),local_e0[local_40],
                  local_f0[local_40],local_598[0],local_5a8,local_598[1],local_5a0);
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
        local_570 = (local_e0[local_40] - local_550) + local_5b8 +
                    ((long)local_558 + local_5b8 * 2 + (1 - local_550)) *
                    ((local_f0[local_40] - local_560) + local_5c0);
        local_130[local_40] =
             GA[local_598[3]].ptr[local_578] +
             local_570 * ga_types[GA[local_598[3]].type + -1000].size;
        local_100[local_40] = (long)local_558 + local_5b8 * 2 + (1 - local_550);
      }
    }
    else {
      for (local_40 = 0; local_40 < local_60; local_40 = local_40 + 1) {
        local_98 = *(Integer *)((long)local_58 + local_40 * 8);
        pnga_distribution(in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                          in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        local_e0[local_40] = local_118;
        local_f0[local_40] = local_110;
        local_e8[local_40] = local_128;
        local_f8[local_40] = local_120;
        pnga_access_block_ptr
                  (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                   in_stack_fffffffffffff8c8);
        pnga_release_block(local_10,local_98);
      }
    }
    local_50 = (long)GA[local_10 + 1000].elemsize;
    GAbytes.gattot = (double)local_50 * (double)local_30 + GAbytes.gattot;
    local_98 = *(long *)((long)local_108 + GAme * 8);
    GAbytes.gatloc =
         (double)local_50 * (double)*(long *)((long)local_a8 + local_98 * 8) + GAbytes.gatloc;
    *local_b0 = local_c0;
    *local_b8 = local_c0 + local_30;
    for (local_38 = 1; local_38 < local_60; local_38 = local_38 + 1) {
      local_b0[local_38] =
           local_b0[local_38 + -1] +
           *(long *)((long)local_a8 + *(long *)((long)local_58 + (local_38 + -1) * 8) * 8) * 8;
      local_b8[local_38] =
           local_b8[local_38 + -1] +
           *(long *)((long)local_a8 + *(long *)((long)local_58 + (local_38 + -1) * 8) * 8) * 8;
    }
    for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
      local_48 = *(long *)((long)local_108 + local_38 * 8);
      if (0 < GA[local_80].num_rstrctd) {
        local_48 = GA[local_80].rank_rstrctd[*(long *)((long)local_108 + local_38 * 8)];
      }
      lVar3 = *(long *)((long)local_a0 + local_48 * 8);
      *(long *)((long)local_a0 + local_48 * 8) = *(long *)((long)local_a0 + local_48 * 8) + 1;
      local_48 = *(ulong *)((long)local_68 + local_48 * 8);
      *(long *)(local_b8[local_48] + lVar3 * 8) = local_18 + local_38 * local_50;
      if (((*(long *)(local_20 + local_38 * 8) < (long)local_e0[local_48]) ||
          ((long)local_e8[local_48] < *(long *)(local_20 + local_38 * 8))) ||
         ((*(long *)(local_28 + local_38 * 8) < (long)local_f0[local_48] ||
          ((long)local_f8[local_48] < *(long *)(local_28 + local_38 * 8))))) {
        in_stack_fffffffffffff5f8 = local_e8[local_48];
        in_stack_fffffffffffff600 = (armci_giov_t *)local_f0[local_48];
        sprintf(local_8c8,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",local_48 & 0xffffffff,
                *(undefined8 *)(local_20 + local_38 * 8),*(undefined8 *)(local_28 + local_38 * 8),
                local_e0[local_48],in_stack_fffffffffffff5f8,in_stack_fffffffffffff600,
                local_f8[local_48]);
        pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      }
      *(long *)(local_b0[local_48] + lVar3 * 8) =
           local_130[local_48] +
           local_50 *
           (((*(long *)(local_28 + local_38 * 8) - local_f0[local_48]) * local_100[local_48] +
            *(long *)(local_20 + local_38 * 8)) - local_e0[local_48]);
    }
    if (GA[local_80].distr_type == 0) {
      for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
        local_c4 = (undefined4)local_50;
        local_d8 = local_b0[local_38];
        local_d0 = local_b8[local_38];
        local_c8 = (undefined4)
                   *(undefined8 *)((long)local_a8 + *(long *)((long)local_58 + local_38 * 8) * 8);
        if (local_90 < 0) {
          local_98 = *(long *)((long)local_58 + local_38 * 8);
          if (0 < GA[local_80].num_rstrctd) {
            local_98 = GA[local_80].rstrctd_list[local_98];
          }
        }
        else {
          local_98 = (long)PGRP_LIST[local_90].inv_map_proc_list
                           [*(long *)((long)local_58 + local_38 * 8)];
        }
        local_8cc = ARMCI_GetV(in_stack_fffffffffffff600,
                               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                               (int)in_stack_fffffffffffff5f8);
        if (local_8cc != 0) {
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
      }
    }
    else if (GA[local_80].distr_type == 1) {
      for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
        local_c4 = (undefined4)local_50;
        local_d8 = local_b0[local_38];
        local_d0 = local_b8[local_38];
        local_c8 = (undefined4)
                   *(undefined8 *)((long)local_a8 + *(long *)((long)local_58 + local_38 * 8) * 8);
        local_98 = *(long *)((long)local_58 + local_38 * 8) % local_88;
        if (-1 < local_90) {
          local_98 = (long)PGRP_LIST[local_90].inv_map_proc_list[local_98];
        }
        local_8d0 = ARMCI_GetV(in_stack_fffffffffffff600,
                               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                               (int)in_stack_fffffffffffff5f8);
        if (local_8d0 != 0) {
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
      }
    }
    else if (GA[local_80].distr_type == 2) {
      for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
        local_c4 = (int)local_50;
        local_d8 = local_b0[local_38];
        local_d0 = local_b8[local_38];
        local_c8 = (int)*(undefined8 *)
                         ((long)local_a8 + *(long *)((long)local_58 + local_38 * 8) * 8);
        local_98 = *(undefined8 *)((long)local_58 + local_38 * 8);
        sVar1 = GA[local_80].ndim;
        local_918 = (int)sVar1;
        local_910 = (int)local_98;
        local_908[0] = (long)local_910 % GA[local_80].num_blocks[0];
        for (local_914 = 1; local_914 < sVar1; local_914 = local_914 + 1) {
          local_910 = (int)(((long)local_910 - local_908[local_914 + -1]) /
                           GA[local_80].num_blocks[local_914 + -1]);
          local_908[local_914] = (long)local_910 % GA[local_80].num_blocks[local_914];
        }
        local_908[0] = local_908[0] % (long)GA[local_80].nblock[0];
        local_908[1] = local_908[1] % (long)GA[local_80].nblock[1];
        local_91c = (int)GA[local_80].ndim;
        for (local_920 = 0; local_920 < local_91c; local_920 = local_920 + 1) {
          alStack_958[local_920] = local_908[local_920] % (long)GA[local_80].nblock[local_920];
        }
        local_98 = alStack_958[local_91c + -1];
        for (local_920 = local_91c + -2; -1 < local_920; local_920 = local_920 + -1) {
          local_98 = local_98 * GA[local_80].nblock[local_920] + alStack_958[local_920];
        }
        if (-1 < local_90) {
          local_98 = (long)PGRP_LIST[local_90].inv_map_proc_list[local_98];
        }
        local_90c = ARMCI_GetV(in_stack_fffffffffffff600,
                               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                               (int)in_stack_fffffffffffff5f8);
        if (local_90c != 0) {
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
      }
    }
    else if ((GA[local_80].distr_type == 3) || (GA[local_80].distr_type == 4)) {
      for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
        local_c4 = (int)local_50;
        local_d8 = local_b0[local_38];
        local_d0 = local_b8[local_38];
        local_c8 = (int)*(undefined8 *)
                         ((long)local_a8 + *(long *)((long)local_58 + local_38 * 8) * 8);
        local_98 = *(undefined8 *)((long)local_58 + local_38 * 8);
        sVar1 = GA[local_80].ndim;
        local_9a8 = (int)sVar1;
        local_9a0 = (int)local_98;
        local_998[0] = (long)local_9a0 % GA[local_80].num_blocks[0];
        for (local_9a4 = 1; local_9a4 < sVar1; local_9a4 = local_9a4 + 1) {
          local_9a0 = (int)(((long)local_9a0 - local_998[local_9a4 + -1]) /
                           GA[local_80].num_blocks[local_9a4 + -1]);
          local_998[local_9a4] = (long)local_9a0 % GA[local_80].num_blocks[local_9a4];
        }
        local_998[0] = local_998[0] % (long)GA[local_80].nblock[0];
        local_998[1] = local_998[1] % (long)GA[local_80].nblock[1];
        local_9ac = (int)GA[local_80].ndim;
        for (local_9b0 = 0; local_9b0 < local_9ac; local_9b0 = local_9b0 + 1) {
          alStack_9e8[local_9b0] = local_998[local_9b0] % (long)GA[local_80].nblock[local_9b0];
        }
        local_98 = alStack_9e8[local_9ac + -1];
        for (local_9b0 = local_9ac + -2; -1 < local_9b0; local_9b0 = local_9b0 + -1) {
          local_98 = local_98 * GA[local_80].nblock[local_9b0] + alStack_9e8[local_9b0];
        }
        if (-1 < local_90) {
          local_98 = (long)PGRP_LIST[local_90].inv_map_proc_list[local_98];
        }
        local_99c = ARMCI_GetV(in_stack_fffffffffffff600,
                               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                               (int)in_stack_fffffffffffff5f8);
        if (local_99c != 0) {
          pnga_error(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        }
      }
    }
    free(local_78);
    free(local_70);
  }
  return;
}

Assistant:

void pnga_gather2d(Integer g_a, void *v, Integer *i, Integer *j,
                         Integer nv)
{
    Integer k, kk, proc, item_size;
    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    Integer nproc, p_handle, iproc;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    Integer subscrpt[2];
    
    if (nv < 1) return;

    ga_check_handleM(g_a, "ga_gather");
    
    GAstat.numgat++;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }

    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int)(nproc *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int)(num_blocks *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
    
    owner = (Integer *)buf1; 
    count = owner+ nv;
    if (GA[handle].distr_type == REGULAR) {
      nelem = count + nproc;
      aproc = count + 2 * nproc;
      map =   count + 3 * nproc;
    } else {
      nelem = count + num_blocks;
      aproc = count + 2 * num_blocks;
      map =   count + 3 * num_blocks;
    }
   
    if (GA[handle].distr_type == REGULAR) {
      /* initialize the counters and nelem */
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }

    /* find proc or block that owns the (i,j) element; store it in temp: */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    GAstat.numgat_procs += naproc;
    
    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
          iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    item_size = GA[GA_OFFSET + g_a].elemsize;
    GAbytes.gattot += (double)item_size*nv;
    /*This stuff is probably completely wrong. Doesn't affect performance,
     * just statistics. */
    iproc = owner[GAme];
    GAbytes.gatloc += (double)item_size * nelem[iproc];

    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
          proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc]; 
        ptr_dst[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
                 (int)proc,(long)i[k],(long)j[k],
                 (long)ilo[proc],(long)ihi[proc],
                 (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_src[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);
}